

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O1

void plutovg_path_traverse
               (plutovg_path_t *path,plutovg_path_traverse_func_t traverse_func,void *closure)

{
  int iVar1;
  plutovg_path_element_t *ppVar2;
  long lVar3;
  int iVar4;
  plutovg_path_command_t pVar5;
  int iVar6;
  plutovg_point_t points [3];
  plutovg_path_element_t local_48;
  plutovg_path_element_t local_40;
  plutovg_path_element_t local_38;
  
  iVar1 = (path->elements).size;
  if (0 < iVar1) {
    ppVar2 = (path->elements).data;
    iVar6 = 0;
    do {
      lVar3 = (long)iVar6;
      pVar5 = ppVar2[lVar3].header.command;
      if (pVar5 < PLUTOVG_PATH_COMMAND_CUBIC_TO) {
LAB_0010b6c9:
        local_48 = ppVar2[lVar3 + 1];
      }
      else if (pVar5 == PLUTOVG_PATH_COMMAND_CUBIC_TO) {
        local_48 = ppVar2[lVar3 + 1];
        local_40 = ppVar2[lVar3 + 2];
        local_38 = ppVar2[lVar3 + 3];
      }
      else if (pVar5 == PLUTOVG_PATH_COMMAND_CLOSE) goto LAB_0010b6c9;
      iVar6 = *(int *)((long)ppVar2 + lVar3 * 8 + 4) + iVar6;
      switch(ppVar2[lVar3].header.command) {
      case PLUTOVG_PATH_COMMAND_MOVE_TO:
        pVar5 = PLUTOVG_PATH_COMMAND_MOVE_TO;
        break;
      case PLUTOVG_PATH_COMMAND_LINE_TO:
        pVar5 = PLUTOVG_PATH_COMMAND_LINE_TO;
        break;
      case PLUTOVG_PATH_COMMAND_CUBIC_TO:
        pVar5 = PLUTOVG_PATH_COMMAND_CUBIC_TO;
        iVar4 = 3;
        goto LAB_0010b740;
      case PLUTOVG_PATH_COMMAND_CLOSE:
        pVar5 = PLUTOVG_PATH_COMMAND_CLOSE;
        break;
      default:
        goto switchD_0010b70b_default;
      }
      iVar4 = 1;
LAB_0010b740:
      (*traverse_func)(closure,pVar5,&local_48.point,iVar4);
switchD_0010b70b_default:
    } while (iVar6 < iVar1);
  }
  return;
}

Assistant:

void plutovg_path_traverse(const plutovg_path_t* path, plutovg_path_traverse_func_t traverse_func, void* closure)
{
    plutovg_path_iterator_t it;
    plutovg_path_iterator_init(&it, path);

    plutovg_point_t points[3];
    while(plutovg_path_iterator_has_next(&it)) {
        switch(plutovg_path_iterator_next(&it, points)) {
        case PLUTOVG_PATH_COMMAND_MOVE_TO:
            traverse_func(closure, PLUTOVG_PATH_COMMAND_MOVE_TO, points, 1);
            break;
        case PLUTOVG_PATH_COMMAND_LINE_TO:
            traverse_func(closure, PLUTOVG_PATH_COMMAND_LINE_TO, points, 1);
            break;
        case PLUTOVG_PATH_COMMAND_CUBIC_TO:
            traverse_func(closure, PLUTOVG_PATH_COMMAND_CUBIC_TO, points, 3);
            break;
        case PLUTOVG_PATH_COMMAND_CLOSE:
            traverse_func(closure, PLUTOVG_PATH_COMMAND_CLOSE, points, 1);
            break;
        }
    }
}